

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void absl::lts_20240722::container_internal::SetCtrl
               (CommonFields *c,size_t i,ctrl_t h,size_t slot_size)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ctrl_t *ctrl;
  size_t slot_size_local;
  ctrl_t h_local;
  size_t i_local;
  CommonFields *c_local;
  
  DoSanitizeOnSetCtrl(c,i,h,slot_size);
  pcVar1 = CommonFields::control(c);
  pcVar1[i] = h;
  sVar2 = NumClonedBytes();
  sVar3 = CommonFields::capacity(c);
  sVar4 = NumClonedBytes();
  sVar5 = CommonFields::capacity(c);
  pcVar1[(i - sVar2 & sVar3) + (sVar4 & sVar5)] = h;
  return;
}

Assistant:

inline void SetCtrl(const CommonFields& c, size_t i, ctrl_t h,
                    size_t slot_size) {
  DoSanitizeOnSetCtrl(c, i, h, slot_size);
  ctrl_t* ctrl = c.control();
  ctrl[i] = h;
  ctrl[((i - NumClonedBytes()) & c.capacity()) +
       (NumClonedBytes() & c.capacity())] = h;
}